

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O2

int read_nal_unit(h264_stream_t *h,uint8_t *buf,int size)

{
  nal_t *pnVar1;
  sps_subset_t *psVar2;
  sps_subset_t *psVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  anon_union_8_1_8e248099_for_sps_subset_t_1 aVar6;
  undefined7 uVar7;
  int iVar8;
  uint32_t uVar9;
  uint uVar10;
  uint32_t uVar11;
  uint8_t *rbsp_buf;
  bs_t *b;
  int rbsp_size;
  int nal_size;
  
  pnVar1 = h->nal;
  _rbsp_size = CONCAT44(size,size);
  rbsp_buf = (uint8_t *)calloc(1,(long)size);
  iVar8 = nal_to_rbsp(buf,&nal_size,rbsp_buf,&rbsp_size);
  if (iVar8 < 0) {
LAB_0011ddac:
    free(rbsp_buf);
    goto LAB_0011ddb4;
  }
  b = bs_new(rbsp_buf,(long)rbsp_size);
  bs_skip_u(b,1);
  uVar9 = bs_read_u(b,2);
  pnVar1->nal_ref_idc = uVar9;
  uVar9 = bs_read_u(b,5);
  pnVar1->nal_unit_type = uVar9;
  if (uVar9 == 0xe) {
LAB_0011dc94:
    uVar10 = bs_read_u1(b);
    pnVar1->svc_extension_flag = SUB41(uVar10,0);
LAB_0011dcaf:
    if ((uVar10 & 1) != 0) {
      read_nal_unit_header_svc_extension(pnVar1->nal_svc_ext,b);
      uVar9 = pnVar1->nal_unit_type;
    }
  }
  else {
    if (uVar9 == 0x15) {
      uVar11 = bs_read_u1(b);
      pnVar1->avc_3d_extension_flag = SUB41(uVar11,0);
      uVar10 = (uint)pnVar1->svc_extension_flag;
      goto LAB_0011dcaf;
    }
    if (uVar9 == 0x14) goto LAB_0011dc94;
  }
  switch(uVar9) {
  case 1:
  case 5:
  case 0x13:
  case 0x14:
    read_slice_layer_rbsp(h,b);
    goto LAB_0011dd81;
  default:
    free(b);
    goto LAB_0011ddac;
  case 7:
    read_seq_parameter_set_rbsp(h->sps,b);
    read_rbsp_trailing_bits(b);
    memcpy(h->sps_table[h->sps->seq_parameter_set_id],h->sps,0x1028);
    goto LAB_0011dd81;
  case 8:
    read_pic_parameter_set_rbsp(h,b);
    break;
  case 9:
    read_access_unit_delimiter_rbsp(h,b);
    break;
  case 10:
  case 0xb:
    break;
  case 0xe:
    read_prefix_nal_unit_rbsp(h->nal,b);
    break;
  case 0xf:
    read_subset_seq_parameter_set_rbsp(h->sps_subset,b);
    read_rbsp_trailing_bits(b);
    psVar2 = h->sps_subset;
    uVar7 = *(undefined7 *)&psVar2->field_0x11;
    psVar3 = h->sps_subset_table[psVar2->sps->seq_parameter_set_id];
    psVar3->additional_extension2_flag = psVar2->additional_extension2_flag;
    *(undefined7 *)&psVar3->field_0x11 = uVar7;
    aVar6 = psVar2->field_1;
    psVar3->sps = psVar2->sps;
    psVar3->field_1 = aVar6;
    goto LAB_0011dd81;
  }
  read_rbsp_trailing_bits(b);
LAB_0011dd81:
  puVar4 = b->p;
  puVar5 = b->end;
  free(b);
  free(rbsp_buf);
  if (puVar5 < puVar4) {
LAB_0011ddb4:
    nal_size = -1;
  }
  else {
  }
  return nal_size;
}

Assistant:

int read_nal_unit(h264_stream_t* h, uint8_t* buf, int size)
{
    nal_t* nal = h->nal;

    int nal_size = size;
    int rbsp_size = size;
    uint8_t* rbsp_buf = (uint8_t*)calloc(1, rbsp_size);

    if( 1 )
    {
        int rc = nal_to_rbsp(buf, &nal_size, rbsp_buf, &rbsp_size);

        if (rc < 0) { free(rbsp_buf); return -1; } // handle conversion error
    }

    if( 0 )
    {
        rbsp_size = size*3/4; // NOTE this may have to be slightly smaller (3/4 smaller, worst case) in order to be guaranteed to fit
    }

    bs_t* b = bs_new(rbsp_buf, rbsp_size);
    /* forbidden_zero_bit */ bs_skip_u(b, 1);
    nal->nal_ref_idc = bs_read_u(b, 2);
    nal->nal_unit_type = bs_read_u(b, 5);
    
    if( nal->nal_unit_type == 14 || nal->nal_unit_type == 21 || nal->nal_unit_type == 20 )
    {
        if( nal->nal_unit_type != 21 )
        {
            nal->svc_extension_flag = bs_read_u1(b);
        }
        else
        {
            nal->avc_3d_extension_flag = bs_read_u1(b);
        }
        
        if( nal->svc_extension_flag )
        {
            read_nal_unit_header_svc_extension(nal->nal_svc_ext, b);
        }
    }

    switch ( nal->nal_unit_type )
    {
        case NAL_UNIT_TYPE_CODED_SLICE_IDR:
        case NAL_UNIT_TYPE_CODED_SLICE_NON_IDR:  
        case NAL_UNIT_TYPE_CODED_SLICE_AUX:
            read_slice_layer_rbsp(h, b);
            break;

#ifdef HAVE_SEI
        case NAL_UNIT_TYPE_SEI:
            read_sei_rbsp(h, b);
            read_rbsp_trailing_bits(b);
            break;
#endif

        case NAL_UNIT_TYPE_SPS: 
            read_seq_parameter_set_rbsp(h->sps, b);
            read_rbsp_trailing_bits(b);
            
            if( 1 )
            {
                memcpy(h->sps_table[h->sps->seq_parameter_set_id], h->sps, sizeof(sps_t));
            }

            break;

        case NAL_UNIT_TYPE_PPS:   
            read_pic_parameter_set_rbsp(h, b);
            read_rbsp_trailing_bits(b);
            break;

        case NAL_UNIT_TYPE_AUD:     
            read_access_unit_delimiter_rbsp(h, b); 
            read_rbsp_trailing_bits(b);
            break;

        case NAL_UNIT_TYPE_END_OF_SEQUENCE: 
            read_end_of_seq_rbsp(h, b);
            read_rbsp_trailing_bits(b);
            break;

        case NAL_UNIT_TYPE_END_OF_STREAM: 
            read_end_of_stream_rbsp(h, b);
            read_rbsp_trailing_bits(b);
            break;

        //SVC support
        case NAL_UNIT_TYPE_SUBSET_SPS:
            read_subset_seq_parameter_set_rbsp(h->sps_subset, b);
            read_rbsp_trailing_bits(b);
            
            if( 1 )
            {
                memcpy(h->sps_subset_table[h->sps_subset->sps->seq_parameter_set_id], h->sps_subset, sizeof(sps_subset_t));
                //memcpy(h->sps_subset_table[h->sps_subset->sps->seq_parameter_set_id]->sps, h->sps_subset->sps, sizeof(sps_t));
                //memcpy(h->sps_subset_table[h->sps_subset->sps->seq_parameter_set_id]->sps_svc_ext, h->sps_subset->sps_svc_ext, sizeof(sps_svc_ext_t));
                //h->sps_subset_table[h->sps_subset->sps->seq_parameter_set_id]->additional_extension2_flag = h->sps_subset->additional_extension2_flag;
            }

            break;
            
        //prefix NAL
        case NAL_UNIT_TYPE_PREFIX_NAL:
            read_prefix_nal_unit_rbsp(h->nal, b);
            read_rbsp_trailing_bits(b);
            break;
            
        //SVC support
        case NAL_UNIT_TYPE_CODED_SLICE_SVC_EXTENSION:            
            read_slice_layer_rbsp(h, b);
            
            break;
            
        case NAL_UNIT_TYPE_FILLER:
        case NAL_UNIT_TYPE_SPS_EXT:
        case NAL_UNIT_TYPE_UNSPECIFIED:
        case NAL_UNIT_TYPE_CODED_SLICE_DATA_PARTITION_A:  
        case NAL_UNIT_TYPE_CODED_SLICE_DATA_PARTITION_B: 
        case NAL_UNIT_TYPE_CODED_SLICE_DATA_PARTITION_C:
        default:
            bs_free(b);
            free(rbsp_buf);
            return -1;
    }

    if (bs_overrun(b)) { bs_free(b); free(rbsp_buf); return -1; }

    if( 0 )
    {
        // now get the actual size used
        rbsp_size = bs_pos(b);

        int rc = rbsp_to_nal(rbsp_buf, &rbsp_size, buf, &nal_size);
        if (rc < 0) { bs_free(b); free(rbsp_buf); return -1; }
    }

    bs_free(b);
    free(rbsp_buf);

    return nal_size;
}